

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

Object * resolveExpression(Object *__return_storage_ptr__,Expression *expression,Environment *env)

{
  char cVar1;
  TokenType TVar2;
  Expression *pEVar3;
  Expression *expression_00;
  int iVar4;
  Instance *pIVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  LiteralType LVar9;
  ulong uVar10;
  ulong uVar11;
  Object *pOVar12;
  LiteralType LVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  Object *pOVar18;
  bool bVar19;
  bool bVar20;
  anon_union_8_4_50a03f35_for_Literal_2 aVar21;
  double dVar22;
  anon_union_8_4_50a03f35_for_Literal_2 aVar23;
  anon_union_8_4_50a03f35_for_Literal_2 aVar24;
  Literal LVar25;
  Literal LVar26;
  Object a;
  Object local_70;
  
  switch(expression->type) {
  case EXPR_BINARY:
    uVar16 = (expression->field_1).binary.line;
    uVar7 = (ulong)uVar16;
    TVar2 = (expression->field_1).binary.op.type;
    pEVar3 = (expression->field_1).binary.right;
    LVar25 = resolveLiteral((expression->field_1).binary.left,uVar16,env);
    aVar21 = LVar25.field_2;
    pIVar5 = LVar25._0_8_;
    LVar26 = resolveLiteral(pEVar3,uVar16,env);
    aVar24 = LVar26.field_2;
    uVar10 = LVar26._0_8_ >> 0x20;
    if (TVar2 == TOKEN_PLUS && (uVar10 == 2 && (ulong)pIVar5 >> 0x20 == 2)) {
      sVar8 = strlen(aVar21.sVal);
      sVar6 = strlen(aVar24.sVal);
      pcVar17 = (char *)malloc(sVar8 + sVar6 + 1);
      *pcVar17 = '\0';
      strcat(pcVar17,aVar21.sVal);
      strcat(pcVar17,aVar24.sVal);
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar7 | 0x200000000);
      (__return_storage_ptr__->field_1).routine.name = pcVar17;
      return __return_storage_ptr__;
    }
    if ((((ulong)pIVar5 >> 0x20 & 0xfffffffe) != 0) ||
       (uVar10 != 0 && (LVar26._0_8_ & 0xffffffff00000000) != 0x100000000)) {
      pcVar17 = 
      "\x1b[31m\n[Runtime Error] [Line:%d] Binary operation can only be done on numerical values!\x1b[0m"
      ;
      goto LAB_00105689;
    }
    if ((LVar25.type == LIT_INT) && (LVar26.type == LIT_INT)) {
      pcVar17 = (char *)0x0;
      switch(TVar2) {
      case TOKEN_MINUS:
        pcVar17 = aVar21.sVal + -aVar24.iVal;
        break;
      case TOKEN_PLUS:
        pcVar17 = aVar24.sVal + aVar21.sVal;
        break;
      case TOKEN_SLASH:
        pcVar17 = (char *)(aVar21.iVal / aVar24.iVal);
        break;
      case TOKEN_STAR:
        pcVar17 = (char *)(aVar24.iVal * aVar21.iVal);
        break;
      case TOKEN_PERCEN:
        pcVar17 = (char *)(aVar21.iVal % aVar24.iVal);
        break;
      case TOKEN_CARET:
        dVar22 = pow((double)aVar21.iVal,(double)aVar24.iVal);
        pcVar17 = (char *)(long)dVar22;
      }
    }
    else {
      if (LVar25.type == LIT_INT) {
        aVar21.dVal = (double)aVar21.iVal;
      }
      pIVar5 = (Instance *)((ulong)pIVar5 & 0xffffffff);
      if (LVar26.type == LIT_INT) {
        aVar24.dVal = (double)aVar24.iVal;
      }
      pcVar17 = (char *)0x0;
      switch(TVar2) {
      case TOKEN_MINUS:
        pcVar17 = (char *)(aVar21.dVal - aVar24.dVal);
        break;
      case TOKEN_PLUS:
        pcVar17 = (char *)(aVar21.dVal + aVar24.dVal);
        break;
      case TOKEN_SLASH:
        pcVar17 = (char *)(aVar21.dVal / aVar24.dVal);
        break;
      case TOKEN_STAR:
        pcVar17 = (char *)(aVar21.dVal * aVar24.dVal);
        break;
      case TOKEN_PERCEN:
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] %% can only be applied between two integers!\x1b[0m";
        goto LAB_00105689;
      case TOKEN_CARET:
        pcVar17 = (char *)pow(aVar21.dVal,aVar24.dVal);
      }
    }
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = pIVar5;
    goto LAB_0010559f;
  case EXPR_LOGICAL:
    uVar16 = (expression->field_1).binary.line;
    uVar7 = (ulong)uVar16;
    pEVar3 = (expression->field_1).binary.left;
    TVar2 = (expression->field_1).binary.op.type;
    expression_00 = (expression->field_1).binary.right;
    resolveExpression(&a,pEVar3,env);
    resolveExpression(&local_70,expression_00,env);
    if ((a.type ^ OBJECT_INSTANCE) == OBJECT_NULL &&
        (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL) {
      if (TVar2 != TOKEN_BANG_EQUAL) {
        if (TVar2 != TOKEN_EQUAL_EQUAL) {
          pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Can\'t compare container instances!\x1b[0m"
          ;
          goto LAB_00105689;
        }
        bVar20 = (Instance *)CONCAT44(a.field_1.literal.type,a.field_1.literal.line) ==
                 local_70.field_1.instance;
        goto LAB_0010532f;
      }
      bVar20 = (Instance *)CONCAT44(a.field_1.literal.type,a.field_1.literal.line) ==
               local_70.field_1.instance;
LAB_00105327:
      bVar20 = !bVar20;
LAB_0010532f:
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar7 | 0x300000000);
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = (ulong)bVar20;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
      (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
      return __return_storage_ptr__;
    }
    if (((a.type ^ OBJECT_INSTANCE) == OBJECT_NULL && local_70.type == OBJECT_LITERAL) ||
       (a.type == OBJECT_LITERAL && (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL)) {
      pOVar12 = &local_70;
      if (a.type == OBJECT_LITERAL) {
        pOVar12 = &a;
      }
      pOVar18 = &local_70;
      if (a.type == OBJECT_INSTANCE) {
        pOVar18 = &a;
      }
      if ((pOVar12->field_1).literal.type != LIT_NULL) {
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare between literal and instances!\x1b[0m"
        ;
        goto LAB_00105689;
      }
      if (TVar2 != TOKEN_BANG_EQUAL) {
        if (TVar2 == TOKEN_EQUAL_EQUAL) {
          bVar20 = (pOVar18->field_1).instance == (Instance *)0x0;
          goto LAB_0010532f;
        }
        pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Null can\'t be compared!\x1b[0m";
        goto LAB_00105689;
      }
      bVar20 = (pOVar18->field_1).instance == (Instance *)0x0;
      goto LAB_00105327;
    }
    LVar25 = resolveLiteral(pEVar3,uVar16,env);
    aVar21 = LVar25.field_2;
    uVar10 = LVar25._0_8_;
    LVar26 = resolveLiteral(expression_00,uVar16,env);
    aVar24 = LVar26.field_2;
    uVar15 = uVar10 >> 0x20;
    uVar11 = LVar26._0_8_ >> 0x20;
    if ((uVar15 == 4) || (LVar9 = LVar26.type, LVar9 == LIT_NULL)) {
      uVar10 = uVar7;
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar20 = uVar11 != 4 || uVar15 != 4;
      }
      else if (TVar2 == TOKEN_EQUAL_EQUAL) {
        bVar20 = uVar15 == 4 && uVar11 == 4;
      }
      else {
        bVar20 = false;
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare Null!\x1b[0m",uVar7);
      }
LAB_00105595:
      pcVar17 = (char *)(ulong)bVar20;
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar10 | 0x300000000);
      goto LAB_0010559f;
    }
    LVar13 = LVar25.type;
    if ((LVar13 == LIT_STRING) && (LVar9 == LIT_STRING)) {
      switch(TVar2) {
      case TOKEN_BANG_EQUAL:
        iVar4 = strcmp(aVar21.sVal,aVar24.sVal);
        bVar20 = iVar4 != 0;
        break;
      default:
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Bad logical operator between string operands!\x1b[0m";
        goto LAB_00105689;
      case TOKEN_EQUAL_EQUAL:
        iVar4 = strcmp(aVar21.sVal,aVar24.sVal);
        bVar20 = iVar4 == 0;
        break;
      case TOKEN_GREATER:
        sVar8 = strlen(aVar21.sVal);
        sVar6 = strlen(aVar24.sVal);
        bVar20 = sVar6 < sVar8;
        break;
      case TOKEN_GREATER_EQUAL:
        sVar8 = strlen(aVar21.sVal);
        sVar6 = strlen(aVar24.sVal);
        bVar20 = sVar6 <= sVar8;
        break;
      case TOKEN_LESS:
        sVar8 = strlen(aVar21.sVal);
        sVar6 = strlen(aVar24.sVal);
        bVar20 = sVar8 < sVar6;
        break;
      case TOKEN_LESS_EQUAL:
        sVar8 = strlen(aVar21.sVal);
        sVar6 = strlen(aVar24.sVal);
        bVar20 = sVar8 <= sVar6;
      }
      goto LAB_00105595;
    }
    if ((((LVar13 != LIT_LOGICAL) && (uVar15 != 0)) &&
        ((uVar10 & 0xffffffff00000000) != 0x100000000)) ||
       (((LVar9 != LIT_LOGICAL && (uVar11 != 0)) &&
        ((LVar26._0_8_ & 0xffffffff00000000) != 0x100000000)))) {
      pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad operand for logical operator!\x1b[0m";
      goto LAB_00105689;
    }
    aVar23.iVal = aVar21.iVal;
    if (LVar13 == LIT_INT) {
      aVar23.dVal = (double)aVar21.iVal;
    }
    if (LVar9 == LIT_INT) {
      aVar24.dVal = (double)aVar24.iVal;
    }
    switch(TVar2) {
    case TOKEN_BANG_EQUAL:
      bVar20 = ABS(aVar23.dVal - aVar24.dVal) == 1e-25;
      bVar19 = ABS(aVar23.dVal - aVar24.dVal) < 1e-25;
      goto LAB_001055f2;
    case TOKEN_COMMA:
    case TOKEN_DOT:
    case TOKEN_COLON:
    case TOKEN_EQUAL:
      break;
    case TOKEN_EQUAL_EQUAL:
      aVar23.dVal = ABS(aVar23.dVal - aVar24.dVal);
      aVar24.sVal = (char *)0x3abef2d0f5da7dd9;
    case TOKEN_LESS_EQUAL:
      bVar20 = aVar24.dVal < aVar23.dVal;
LAB_001055e5:
      aVar21.iVal._1_7_ = 0;
      aVar21.lVal._0_1_ = !bVar20;
      break;
    case TOKEN_GREATER:
      bVar20 = aVar23.dVal == aVar24.dVal;
      bVar19 = aVar23.dVal < aVar24.dVal;
      goto LAB_001055f2;
    case TOKEN_GREATER_EQUAL:
      bVar20 = aVar23.dVal < aVar24.dVal;
      goto LAB_001055e5;
    case TOKEN_LESS:
      bVar20 = aVar24.dVal == aVar23.dVal;
      bVar19 = aVar24.dVal < aVar23.dVal;
LAB_001055f2:
      aVar21.iVal._1_7_ = 0;
      aVar21.lVal._0_1_ = !bVar19 && !bVar20;
      break;
    default:
      if (TVar2 == TOKEN_AND) {
        if ((LVar13 != LIT_LOGICAL) || (LVar9 != LIT_LOGICAL)) {
          pcVar17 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'And\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105689;
        }
        aVar21._0_4_ = LVar25.field_2._0_4_ & LVar26.field_2._0_4_;
        aVar21.iVal._4_4_ = 0;
      }
      else if (TVar2 == TOKEN_OR) {
        if ((LVar13 != LIT_LOGICAL) || (LVar9 != LIT_LOGICAL)) {
          pcVar17 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'Or\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105689;
        }
        aVar21._0_4_ = LVar25.field_2._0_4_ | LVar26.field_2._0_4_;
        aVar21.iVal._4_4_ = 0;
      }
    }
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = (Instance *)(uVar10 | 0x300000000);
    ((anon_union_8_4_50a03f35_for_Literal_2 *)((long)&__return_storage_ptr__->field_1 + 8))->dVal =
         (double)aVar21;
    break;
  case EXPR_LITERAL:
    __return_storage_ptr__->type = OBJECT_LITERAL;
    aVar21 = (anon_union_8_4_50a03f35_for_Literal_2)(expression->field_1).binary.left;
    (__return_storage_ptr__->field_1).instance = *(Instance **)&expression->field_1;
    (__return_storage_ptr__->field_1).literal.field_2 = aVar21;
    break;
  case EXPR_VARIABLE:
    env_get(__return_storage_ptr__,(expression->field_1).variable.name,
            (expression->field_1).binary.line,env);
    break;
  case EXPR_ARRAY:
    uVar16 = (expression->field_1).binary.line;
    pcVar17 = (expression->field_1).arrayExpression.identifier;
    LVar25 = resolveLiteral((expression->field_1).binary.left,uVar16,env);
    if (LVar25.type != LIT_INT) {
      pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Array index must be an integer!\x1b[0m";
      goto LAB_0010563d;
    }
    env_get(&a,pcVar17,uVar16,env);
    if ((a.type != OBJECT_LITERAL) || (a.field_1.literal.type != LIT_STRING)) {
      env_arr_get(__return_storage_ptr__,pcVar17,uVar16,LVar25.field_2.iVal,env);
      return __return_storage_ptr__;
    }
    sVar8 = strlen(a.field_1.routine.name);
    lVar14 = (long)LVar25.field_2._0_4_;
    if ((lVar14 < 1) || ((long)(sVar8 + 1) < lVar14)) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] String index out of range [%ld]!\x1b[0m",
             (ulong)uVar16);
      stop();
    }
    if (lVar14 == sVar8 + 1) goto switchD_00104e82_caseD_7;
    cVar1 = *(char *)((long)a.field_1.arr.values + lVar14 + -1);
    pcVar17 = (char *)malloc(2);
    *pcVar17 = cVar1;
    pcVar17[1] = '\0';
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x200000000;
LAB_0010559f:
    (__return_storage_ptr__->field_1).routine.name = pcVar17;
    break;
  case EXPR_CALL:
    resolveCall(__return_storage_ptr__,(expression->field_1).callExpression,env);
    break;
  case EXPR_REFERENCE:
    uVar16 = (expression->field_1).binary.line;
    pEVar3 = (expression->field_1).referenceExpression.member;
    resolveExpression(&a,(expression->field_1).binary.left,env);
    if (a.type == OBJECT_INSTANCE) {
      resolveExpression(__return_storage_ptr__,pEVar3,
                        *(Environment **)
                         (CONCAT44(a.field_1.literal.type,a.field_1.literal.line) + 0x18));
      return __return_storage_ptr__;
    }
    pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Invalid member reference!\x1b[0m";
LAB_0010563d:
    uVar7 = (ulong)uVar16;
LAB_00105689:
    printf(pcVar17,uVar7);
    stop();
  case EXPR_NONE:
switchD_00104e82_caseD_7:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  }
  return __return_storage_ptr__;
}

Assistant:

static Object resolveExpression(Expression* expression, Environment *env){
    //   printf("\nSolving expression : %s", expressionNames[expression->type]);
    switch(expression->type){
        case EXPR_LITERAL:
            return fromLiteral(expression->literal);
        case EXPR_BINARY:
            return resolveBinary(expression->binary, env);
        case EXPR_LOGICAL:
            return resolveLogical(expression->logical, env);
        case EXPR_NONE:
            return nullObject;
        case EXPR_VARIABLE:
            return resolveVariable(expression->variable, env);
        case EXPR_ARRAY:
            return resolveArray(expression->arrayExpression, env);
        case EXPR_CALL:
            return resolveCall(expression->callExpression, env);
        case EXPR_REFERENCE:
            return resolveReference(expression->referenceExpression, env);
    }
}